

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

void google::protobuf::internal::FailDynamicCast(MessageLite *from,MessageLite *to)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *this;
  string_view v;
  string_view sVar2;
  string_view str;
  string_view str_00;
  LogMessage LStack_38;
  
  v = MessageLite::GetTypeName(to);
  iVar1 = (*from->_vptr_MessageLite[4])(from);
  if (*(char *)(CONCAT44(extraout_var,iVar1) + 0x3d) == '\x01') {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0xd5);
    str._M_str = "Cannot downcast from a DynamicMessage to generated type ";
    str._M_len = 0x38;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_38,str)
    ;
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,v);
  }
  else {
    sVar2 = MessageLite::GetTypeName(from);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0xda);
    str_00._M_str = "Cannot downcast ";
    str_00._M_len = 0x10;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&LStack_38,str_00);
    this = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,sVar2);
    sVar2._M_str = " to ";
    sVar2._M_len = 4;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this,sVar2);
    absl::lts_20250127::log_internal::LogMessage::operator<<(this,v);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

void FailDynamicCast(const MessageLite& from, const MessageLite& to) {
  const auto to_name = to.GetTypeName();
  if (internal::GetClassData(from)->is_dynamic) {
    ABSL_LOG(FATAL)
        << "Cannot downcast from a DynamicMessage to generated type "
        << to_name;
  }
  const auto from_name = from.GetTypeName();
  ABSL_LOG(FATAL) << "Cannot downcast " << from_name << " to " << to_name;
}